

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O2

bool __thiscall DatetimeParser::initializeSopq(DatetimeParser *this,Pig *pig)

{
  int iVar1;
  bool bVar2;
  uint c;
  int iVar3;
  size_type previous;
  tm *__tp;
  time_t tVar4;
  allocator<char> local_49;
  time_t now;
  
  previous = Pig::cursor(pig);
  std::__cxx11::string::string<std::allocator<char>>((string *)&now,"sopq",&local_49);
  bVar2 = Pig::skipLiteral(pig,(string *)&now);
  std::__cxx11::string::~string((string *)&now);
  if (bVar2) {
    c = Pig::peek(pig);
    bVar2 = unicodeLatinAlpha(c);
    if ((!bVar2) && (bVar2 = unicodeLatinDigit(c), !bVar2)) {
      now = time((time_t *)0x0);
      __tp = localtime(&now);
      iVar1 = __tp->tm_mon;
      iVar3 = iVar1 - iVar1 % 3;
      __tp->tm_mon = (iVar1 - iVar1 % 3) + -3;
      if (iVar3 < 3) {
        __tp->tm_mon = iVar3 + 9;
        __tp->tm_year = __tp->tm_year + -1;
      }
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_mday = 1;
      __tp->tm_isdst = -1;
      tVar4 = mktime(__tp);
      this->_date = tVar4;
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool DatetimeParser::initializeSopq (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skipLiteral ("sopq"))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_mon -= t->tm_mon % 3;
      t->tm_mon -= 3;
      if (t->tm_mon < 0)
      {
        t->tm_mon += 12;
        t->tm_year--;
      }

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_mday = 1;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}